

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Own<kj::AsyncOutputStream,_std::nullptr_t> __thiscall
kj::HttpServer::Connection::reject
          (Connection *this,uint statusCode,StringPtr statusText,HttpHeaders *headers,
          Maybe<unsigned_long> *expectedBodySize)

{
  uint uVar1;
  bool bVar2;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> **ppOVar3;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> **ppOVar4;
  PromiseFulfiller<void> *pPVar5;
  Connection *pCVar6;
  char (*params) [32];
  AsyncOutputStream *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar7;
  Own<kj::AsyncOutputStream,_std::nullptr_t> OVar8;
  Maybe<unsigned_long> *in_stack_00000008;
  bool local_311;
  Maybe<unsigned_long> local_2c8;
  Connection *local_2b8;
  char *pcStack_2b0;
  String local_2a8;
  Exception local_290;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_100;
  Fault local_f8;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_f0;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_kj_result_1;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *fulfiller;
  Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_> local_d8;
  Fault local_c8;
  Fault f_1;
  uint *local_b8;
  DebugComparison<unsigned_int_&,_int> local_b0;
  bool local_81;
  bool _kjCondition_1;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Fault local_58;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *local_50;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *_kj_result;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> method;
  HttpHeaders *headers_local;
  long lStack_28;
  uint statusCode_local;
  Connection *this_local;
  StringPtr statusText_local;
  
  lVar7 = CONCAT44(in_register_00000034,statusCode);
  pCVar6 = (Connection *)statusText.content.size_;
  headers_local._4_4_ = (uint)statusText.content.ptr;
  method.field_1 =
       (anon_union_8_1_a8a2e026_for_OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_2)expectedBodySize;
  lStack_28 = lVar7;
  this_local = pCVar6;
  statusText_local.content.ptr = (char *)headers;
  statusText_local.content.size_ = (size_t)this;
  local_50 = kj::_::readMaybe<kj::OneOf<kj::HttpMethod,kj::HttpConnectMethod>>
                       ((Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)(lVar7 + 0x148))
  ;
  if (local_50 == (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1fad,FAILED,"currentMethod != nullptr","\"already called send()\"",
               (char (*) [22])"already called send()");
    kj::_::Debug::Fault::fatal(&local_58);
  }
  ppOVar3 = mv<kj::OneOf<kj::HttpMethod,kj::HttpConnectMethod>*>(&local_50);
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::OneOf
            ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)&_kj_result,*ppOVar3);
  f.exception._6_1_ =
       OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::is<kj::HttpConnectMethod>
                 ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)&_kj_result);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar2 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
              ((Fault *)&stack0xffffffffffffff80,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1fae,FAILED,"method.is<HttpConnectMethod>()",
               "_kjCondition,\"Only use reject() with CONNECT requests.\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [41])"Only use reject() with CONNECT requests.");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff80);
  }
  local_b8 = (uint *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                (uint *)((long)&headers_local + 4));
  f_1.exception._4_4_ = 200;
  kj::_::DebugExpression<unsigned_int&>::operator<
            (&local_b0,(DebugExpression<unsigned_int&> *)&local_b8,(int *)((long)&f_1.exception + 4)
            );
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_b0);
  params = (char (*) [32])CONCAT71((int7)((ulong)pCVar6 >> 8),bVar2);
  local_311 = bVar2 || 299 < headers_local._4_4_;
  local_81 = local_311;
  if (!bVar2 && 299 >= headers_local._4_4_) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[43]>
              (&local_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1faf,FAILED,"statusCode < 200 || statusCode >= 300",
               "_kjCondition,\"the statusCode must not be 2xx for reject.\"",&local_81,
               (char (*) [43])"the statusCode must not be 2xx for reject.");
    kj::_::Debug::Fault::fatal(&local_c8);
  }
  Promise<kj::HttpServer::Connection::LoopResult>::Promise
            ((Promise<kj::HttpServer::Connection::LoopResult> *)&fulfiller,BREAK_LOOP_CONN_OK);
  Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::Maybe
            (&local_d8,(Promise<kj::HttpServer::Connection::LoopResult> *)&fulfiller);
  Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::operator=
            ((Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *)(lVar7 + 0x178),
             &local_d8);
  Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::~Maybe(&local_d8);
  Promise<kj::HttpServer::Connection::LoopResult>::~Promise
            ((Promise<kj::HttpServer::Connection::LoopResult> *)&fulfiller);
  local_f0 = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>
                       ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                        (lVar7 + 0x188));
  if (local_f0 != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0) {
    ppOVar4 = mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>*>(&local_f0);
    local_100 = *ppOVar4;
    _kj_result_1 = local_100;
    pPVar5 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(local_100);
    kj::_::Debug::makeDescription<char_const(&)[32]>
              (&local_2a8,(Debug *)"\"the tunnel request was rejected\"",
               "the tunnel request was rejected",params);
    Exception::Exception
              (&local_290,DISCONNECTED,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1fb3,&local_2a8);
    (**(pPVar5->super_PromiseRejector)._vptr_PromiseRejector)(pPVar5,&local_290);
    Exception::~Exception(&local_290);
    String::~String(&local_2a8);
    uVar1 = headers_local._4_4_;
    *(undefined1 *)(lVar7 + 0x164) = 1;
    local_2b8 = this_local;
    pcStack_2b0 = statusText_local.content.ptr;
    Maybe<unsigned_long>::Maybe(&local_2c8,in_stack_00000008);
    send(this,statusCode,(void *)(ulong)uVar1,(size_t)local_2b8,(int)pcStack_2b0);
    Maybe<unsigned_long>::~Maybe(&local_2c8);
    OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf
              ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)&_kj_result);
    OVar8.ptr = extraout_RDX;
    OVar8.disposer = (Disposer *)this;
    return OVar8;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
            (&local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1fb2,FAILED,"tunnelWriteGuard != nullptr",
             "\"the tunnel stream was not initialized\"",
             (char (*) [38])"the tunnel stream was not initialized");
  kj::_::Debug::Fault::fatal(&local_f8);
}

Assistant:

kj::Own<kj::AsyncOutputStream> reject(
      uint statusCode,
      kj::StringPtr statusText,
      const HttpHeaders& headers,
      kj::Maybe<uint64_t> expectedBodySize) override {
    auto method = KJ_REQUIRE_NONNULL(currentMethod, "already called send()");
    KJ_REQUIRE(method.is<HttpConnectMethod>(), "Only use reject() with CONNECT requests.");
    KJ_REQUIRE(statusCode < 200 || statusCode >= 300, "the statusCode must not be 2xx for reject.");
    tunnelRejected = Maybe<kj::Promise<LoopResult>>(BREAK_LOOP_CONN_OK);

    auto& fulfiller = KJ_ASSERT_NONNULL(tunnelWriteGuard, "the tunnel stream was not initialized");
    fulfiller->reject(KJ_EXCEPTION(DISCONNECTED, "the tunnel request was rejected"));
    closeAfterSend = true;
    return send(statusCode, statusText, headers, expectedBodySize);
  }